

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trust_store_in_memory_unittest.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::TrustStoreInMemoryTest_DistrustBySPKIOverridesTrust_Test::TestBody
          (TrustStoreInMemoryTest_DistrustBySPKIOverridesTrust_Test *this)

{
  bool bVar1;
  element_type *this_00;
  ParsedTbsCertificate *pPVar2;
  element_type *cert;
  char *message;
  size_t extraout_RDX;
  Span<const_unsigned_char> b;
  AssertHelper local_158;
  Message local_150;
  string local_148;
  CertificateTrust local_128;
  string local_120;
  undefined1 local_100 [8];
  AssertionResult gtest_ar;
  CertificateTrust trust;
  uchar *local_d8;
  string_view local_d0;
  string local_c0;
  shared_ptr<const_bssl::ParsedCertificate> local_90;
  undefined1 local_80 [8];
  TrustStoreInMemory in_memory;
  TrustStoreInMemoryTest_DistrustBySPKIOverridesTrust_Test *this_local;
  
  in_memory.distrusted_spkis_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  TrustStoreInMemory::TrustStoreInMemory((TrustStoreInMemory *)local_80);
  ::std::shared_ptr<const_bssl::ParsedCertificate>::shared_ptr
            (&local_90,&(this->super_TrustStoreInMemoryTest).newroot_);
  TrustStoreInMemory::AddTrustAnchor((TrustStoreInMemory *)local_80,&local_90);
  ::std::shared_ptr<const_bssl::ParsedCertificate>::~shared_ptr(&local_90);
  this_00 = ::std::
            __shared_ptr_access<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&(this->super_TrustStoreInMemoryTest).newroot_);
  pPVar2 = ParsedCertificate::tbs(this_00);
  Span<unsigned_char_const>::Span<bssl::der::Input,void,bssl::der::Input>
            ((Span<unsigned_char_const> *)&trust.enforce_anchor_expiry,&pPVar2->spki_tlv);
  b.size_ = extraout_RDX;
  b.data_ = local_d8;
  local_d0 = BytesAsStringView(stack0xffffffffffffff20,b);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_c0,&local_d0,(allocator<char> *)((long)&trust.type + 3));
  TrustStoreInMemory::AddDistrustedCertificateBySPKI((TrustStoreInMemory *)local_80,&local_c0);
  ::std::__cxx11::string::~string((string *)&local_c0);
  ::std::allocator<char>::~allocator((allocator<char> *)((long)&trust.type + 3));
  cert = ::std::__shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>::get
                   (&(this->super_TrustStoreInMemoryTest).newroot_.
                     super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>);
  register0x00000000 = TrustStoreInMemory::GetTrust((TrustStoreInMemory *)local_80,cert);
  local_128 = CertificateTrust::ForDistrusted();
  CertificateTrust::ToDebugString_abi_cxx11_(&local_120,&local_128);
  CertificateTrust::ToDebugString_abi_cxx11_
            (&local_148,
             (CertificateTrust *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 4));
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_100,"CertificateTrust::ForDistrusted().ToDebugString()",
             "trust.ToDebugString()",&local_120,&local_148);
  ::std::__cxx11::string::~string((string *)&local_148);
  ::std::__cxx11::string::~string((string *)&local_120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_150);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/trust_store_in_memory_unittest.cc"
               ,0x6c,message);
    testing::internal::AssertHelper::operator=(&local_158,&local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    testing::Message::~Message(&local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  TrustStoreInMemory::~TrustStoreInMemory((TrustStoreInMemory *)local_80);
  return;
}

Assistant:

TEST_F(TrustStoreInMemoryTest, DistrustBySPKIOverridesTrust) {
  TrustStoreInMemory in_memory;
  in_memory.AddTrustAnchor(newroot_);
  in_memory.AddDistrustedCertificateBySPKI(
      std::string(BytesAsStringView(newroot_->tbs().spki_tlv)));

  // newroot_ is distrusted.
  CertificateTrust trust = in_memory.GetTrust(newroot_.get());
  EXPECT_EQ(CertificateTrust::ForDistrusted().ToDebugString(),
            trust.ToDebugString());
}